

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

uint __thiscall LinearScan::GetRemainingHelperLength(LinearScan *this,Lifetime *lifetime)

{
  IRKind IVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  Type *pTVar7;
  uint uVar8;
  undefined4 *local_50;
  undefined1 auStack_48 [8];
  Iterator it;
  
  auStack_48._0_4_ = *(undefined4 *)&(this->opHelperBlockIter).list;
  auStack_48._4_4_ = *(undefined4 *)((long)&(this->opHelperBlockIter).list + 4);
  it.list = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
            (this->opHelperBlockIter).current;
  if ((it.list == (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
     (it.list == (this->opHelperBlockIter).list)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_50 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x11e6,"(it.IsValid())","it.IsValid()");
    if (!bVar4) {
LAB_00538f9a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *local_50 = 0;
  }
  else {
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  uVar5 = IR::Instr::GetNumber(this->currentInstr);
  uVar3 = lifetime->end;
  if (lifetime->end < uVar5) {
    uVar3 = uVar5;
  }
  uVar8 = 0;
  do {
    pTVar7 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)auStack_48);
    uVar5 = IR::Instr::GetNumber(&pTVar7->opHelperLabel->super_Instr);
    if (uVar3 < uVar5) {
      return uVar8;
    }
    uVar6 = IR::Instr::GetNumber(pTVar7->opHelperEndInstr);
    if (uVar3 < uVar6) {
      uVar6 = uVar3;
    }
    uVar8 = uVar8 + (uVar6 - uVar5);
    uVar5 = IR::Instr::GetNumber(pTVar7->opHelperEndInstr);
    if ((uVar6 != uVar5) ||
       ((IVar1 = pTVar7->opHelperEndInstr->m_kind, IVar1 != InstrKindLabel &&
        (IVar1 != InstrKindProfiledLabel)))) {
      uVar8 = uVar8 + 1;
    }
    if (it.list == (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_50 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_00538f9a;
      *local_50 = 0;
    }
    it.list = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
              ((it.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if (it.list ==
        (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
        CONCAT44(auStack_48._4_4_,auStack_48._0_4_)) {
      return uVar8;
    }
  } while( true );
}

Assistant:

uint LinearScan::GetRemainingHelperLength(Lifetime *const lifetime)
{
    // Walk the helper block linked list starting from the next helper block until the end of the lifetime
    uint helperLength = 0;
    SList<OpHelperBlock>::Iterator it(opHelperBlockIter);
    Assert(it.IsValid());
    const uint end = max(currentInstr->GetNumber(), lifetime->end);
    do
    {
        const OpHelperBlock &helper = it.Data();
        const uint helperStart = helper.opHelperLabel->GetNumber();
        if(helperStart > end)
        {
            break;
        }

        const uint helperEnd = min(end, helper.opHelperEndInstr->GetNumber());
        helperLength += helperEnd - helperStart;
        if(helperEnd != helper.opHelperEndInstr->GetNumber() || !helper.opHelperEndInstr->IsLabelInstr())
        {
            // A helper block that ends at a label does not return to the function. Since this helper block does not end
            // at a label, include the end instruction as well.
            ++helperLength;
        }
    } while(it.Next());

    return helperLength;
}